

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateRecorder::Impl::copy_compute_pipeline
          (Impl *this,VkComputePipelineCreateInfo *create_info,ScratchAllocator *alloc,
          VkPipeline *base_pipelines,uint32_t base_pipeline_count,VkDevice device,
          PFN_vkGetShaderModuleCreateInfoIdentifierEXT gsmcii,
          VkComputePipelineCreateInfo **out_create_info)

{
  uint uVar1;
  VkSpecializationInfo *info;
  char *__s;
  bool bVar2;
  Impl *__dest;
  Impl *pIVar3;
  VkPipeline pVVar4;
  size_t sVar5;
  void *__dest_00;
  ptrdiff_t _Num;
  size_t size;
  Impl *this_00;
  long *in_FS_OFFSET;
  
  this_00 = (Impl *)alloc;
  __dest = (Impl *)ScratchAllocator::allocate_raw(alloc,0x60,0x10);
  if (__dest != (Impl *)0x0) {
    this_00 = __dest;
    memmove(__dest,create_info,0x60);
  }
  *(uint *)&(__dest->ycbcr_temp_allocator).impl =
       *(uint *)&(__dest->ycbcr_temp_allocator).impl & 0x7ffffc3f;
  for (pIVar3 = (__dest->temp_allocator).impl; pIVar3 != (Impl *)0x0;
      pIVar3 = (Impl *)(pIVar3->blocks).
                       super__Vector_base<Fossilize::ScratchAllocator::Impl::Block,_std::allocator<Fossilize::ScratchAllocator::Impl::Block>_>
                       ._M_impl.super__Vector_impl_data._M_finish) {
    if (*(int *)&(pIVar3->blocks).
                 super__Vector_base<Fossilize::ScratchAllocator::Impl::Block,_std::allocator<Fossilize::ScratchAllocator::Impl::Block>_>
                 ._M_impl.super__Vector_impl_data._M_start == 0x3ba1f5f5) goto LAB_0015e7dd;
  }
  pIVar3 = (Impl *)0x0;
LAB_0015e7dd:
  if (pIVar3 != (Impl *)0x0) {
    *(undefined4 *)&(__dest->ycbcr_temp_allocator).impl = 0;
  }
  if (((ulong)(__dest->ycbcr_temp_allocator).impl & 4) == 0) {
    pVVar4 = (VkPipeline)0x0;
  }
  else {
    if ((__dest->descriptor_sets)._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0)
    goto LAB_0015e802;
    uVar1 = (uint)(__dest->descriptor_sets)._M_h._M_element_count;
    if ((long)(int)uVar1 < 0) goto LAB_0015e802;
    if (base_pipeline_count <= uVar1) {
      if (2 < *(int *)(*in_FS_OFFSET + -0x18)) {
        return false;
      }
      bVar2 = Internal::log_thread_callback(LOG_ERROR,"Base pipeline index is out of range.\n");
      if (!bVar2) {
        copy_compute_pipeline();
        return false;
      }
      return false;
    }
    pVVar4 = base_pipelines[(int)uVar1];
  }
  (__dest->descriptor_sets)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)pVVar4;
LAB_0015e802:
  *(undefined4 *)&(__dest->descriptor_sets)._M_h._M_element_count = 0xffffffff;
  info = (VkSpecializationInfo *)(__dest->descriptor_sets)._M_h._M_buckets;
  if (info != (VkSpecializationInfo *)0x0) {
    copy_specialization_info(this_00,info,alloc,(VkSpecializationInfo **)&__dest->descriptor_sets);
  }
  __s = *(char **)&__dest->should_record_identifier_only;
  sVar5 = strlen(__s);
  size = sVar5 + 1;
  if (size == 0) {
    __dest_00 = (void *)0x0;
  }
  else {
    __dest_00 = ScratchAllocator::allocate_raw(alloc,size,0x10);
    if (__dest_00 != (void *)0x0) {
      memmove(__dest_00,__s,size);
    }
  }
  *(void **)&__dest->should_record_identifier_only = __dest_00;
  bVar2 = copy_pnext_chain(this,__dest->module_identifier_database_iface,alloc,
                           &__dest->module_identifier_database_iface,(DynamicStateInfo *)0x0,0);
  if (!bVar2) {
    return false;
  }
  bVar2 = add_module_identifier
                    ((VkPipelineShaderStageCreateInfo *)&__dest->database_iface,alloc,device,gsmcii)
  ;
  if (!bVar2) {
    return false;
  }
  bVar2 = copy_pnext_chain(this,(__dest->temp_allocator).impl,alloc,&(__dest->temp_allocator).impl,
                           (DynamicStateInfo *)0x0,0);
  if (bVar2) {
    *out_create_info = (VkComputePipelineCreateInfo *)__dest;
    return true;
  }
  return false;
}

Assistant:

bool StateRecorder::Impl::copy_compute_pipeline(const VkComputePipelineCreateInfo *create_info, ScratchAllocator &alloc,
                                                const VkPipeline *base_pipelines, uint32_t base_pipeline_count,
                                                VkDevice device, PFN_vkGetShaderModuleCreateInfoIdentifierEXT gsmcii,
                                                VkComputePipelineCreateInfo **out_create_info)
{
	auto *info = copy(create_info, 1, alloc);
	info->flags = normalize_pipeline_creation_flags(info->flags);
	if (find_pnext<VkPipelineCreateFlags2CreateInfoKHR>(VK_STRUCTURE_TYPE_PIPELINE_CREATE_FLAGS_2_CREATE_INFO_KHR, info->pNext))
		info->flags = 0;

	if (!update_derived_pipeline(info, base_pipelines, base_pipeline_count))
		return false;

	if (info->stage.pSpecializationInfo)
		if (!copy_specialization_info(info->stage.pSpecializationInfo, alloc, &info->stage.pSpecializationInfo))
			return false;

	info->stage.pName = copy(info->stage.pName, strlen(info->stage.pName) + 1, alloc);

	if (!copy_pnext_chain(info->stage.pNext, alloc, &info->stage.pNext, nullptr, 0))
		return false;

	if (!add_module_identifier(&info->stage, alloc, device, gsmcii))
		return false;

	if (!copy_pnext_chain(info->pNext, alloc, &info->pNext, nullptr, 0))
		return false;

	*out_create_info = info;
	return true;
}